

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O0

Gamut parse_gamut(char *str)

{
  int iVar1;
  char *in_RDI;
  Gamut local_4;
  
  iVar1 = strcasecmp(in_RDI,"sRGB");
  if (iVar1 == 0) {
    local_4 = SRGB;
  }
  else {
    iVar1 = strcasecmp(in_RDI,"eRGB");
    if (iVar1 == 0) {
      local_4 = ERGB;
    }
    else {
      iVar1 = strcasecmp(in_RDI,"XYZ");
      if (iVar1 == 0) {
        local_4 = XYZ;
      }
      else {
        iVar1 = strcasecmp(in_RDI,"ProPhotoRGB");
        if (iVar1 == 0) {
          local_4 = ProPhotoRGB;
        }
        else {
          iVar1 = strcasecmp(in_RDI,"ACES2065_1");
          if (iVar1 == 0) {
            local_4 = ACES2065_1;
          }
          else {
            iVar1 = strcasecmp(in_RDI,"REC2020");
            if (iVar1 == 0) {
              local_4 = REC2020;
            }
            else {
              iVar1 = strcasecmp(in_RDI,"DCI_P3");
              if (iVar1 == 0) {
                local_4 = DCI_P3;
              }
              else {
                local_4 = NO_GAMUT;
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static Gamut parse_gamut(const char *str) {
    if (!strcasecmp(str, "sRGB"))
        return SRGB;
    if (!strcasecmp(str, "eRGB"))
        return ERGB;
    if (!strcasecmp(str, "XYZ"))
        return XYZ;
    if (!strcasecmp(str, "ProPhotoRGB"))
        return ProPhotoRGB;
    if (!strcasecmp(str, "ACES2065_1"))
        return ACES2065_1;
    if (!strcasecmp(str, "REC2020"))
        return REC2020;
    if (!strcasecmp(str, "DCI_P3"))
        return DCI_P3;
    return NO_GAMUT;
}